

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O2

void __thiscall
t_dart_generator::generate_service_helpers(t_dart_generator *this,t_service *tservice)

{
  t_struct *tstruct;
  pointer pptVar1;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  allocator local_69;
  _Vector_base<t_function_*,_std::allocator<t_function_*>_> local_68;
  string local_50;
  
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&local_68,&tservice->functions_)
  ;
  for (pptVar1 = local_68._M_impl.super__Vector_impl_data._M_start;
      pptVar1 != local_68._M_impl.super__Vector_impl_data._M_finish; pptVar1 = pptVar1 + 1) {
    tstruct = (*pptVar1)->arglist_;
    std::__cxx11::string::string((string *)&local_50,"",&local_69);
    generate_dart_struct_definition(this,(ostream *)&this->f_service_,tstruct,false,false,&local_50)
    ;
    std::__cxx11::string::~string((string *)&local_50);
    generate_function_helpers(this,*pptVar1);
  }
  std::_Vector_base<t_function_*,_std::allocator<t_function_*>_>::~_Vector_base(&local_68);
  return;
}

Assistant:

void t_dart_generator::generate_service_helpers(t_service* tservice) {
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    t_struct* ts = (*f_iter)->get_arglist();
    generate_dart_struct_definition(f_service_, ts, false, false);
    generate_function_helpers(*f_iter);
  }
}